

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

Real __thiscall NavierStokesBase::volWgtSum(NavierStokesBase *this,string *name,Real time)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  type f;
  pointer __s;
  FabArrayBase *this_00;
  int __c;
  pointer in_RSI;
  Box *in_RDI;
  pointer in_XMM0_Qa;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *this_01;
  Real sm;
  Real vol;
  pair<int,_amrex::Box> *is;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *__range3;
  int ncomp;
  Array4<double> *fabarr;
  MFIter mfi;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxArray baf;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> mf;
  Real *dx;
  Real volwgtsum;
  BoxArray *in_stack_fffffffffffffd88;
  AmrMesh *in_stack_fffffffffffffd90;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffd98;
  BoxArray *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffdb0;
  int nghost;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffdb8;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffdc0;
  Box *bx;
  IntVect *in_stack_fffffffffffffdd0;
  BoxArray *this_02;
  BoxArray *in_stack_fffffffffffffdd8;
  undefined1 *puVar4;
  undefined1 local_1f0 [64];
  reference local_1b0;
  pair<int,_amrex::Box> *local_1a8;
  __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
  local_1a0;
  undefined1 *local_198;
  undefined1 local_190 [96];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  undefined1 local_128 [248];
  DataAllocator local_30;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *local_28;
  pointer local_20;
  pointer local_18;
  char *local_8;
  
  local_28 = (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)0x0;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  local_30.m_arena = (Arena *)amrex::CoordSys::CellSize((CoordSys *)((in_RDI->bigend).vect + 1));
  (**(code **)(*(long *)(in_RDI->smallend).vect + 0xf8))
            (local_20,local_128 + 0xf0,in_RDI,local_18,0);
  iVar1 = (in_RDI->smallend).vect[2];
  iVar3 = amrex::AmrMesh::finestLevel(*(AmrMesh **)in_RDI[0xc].smallend.vect);
  nghost = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  if (iVar1 < iVar3) {
    amrex::BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffd90);
    amrex::AmrMesh::boxArray
              (in_stack_fffffffffffffd90,(int)((ulong)in_stack_fffffffffffffd88 >> 0x20));
    puVar4 = local_128 + 0x88;
    amrex::BoxArray::operator=((BoxArray *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    amrex::BoxArray::coarsen(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               0x7d2208);
    f = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
                  ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                   in_stack_fffffffffffffd90);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_fffffffffffffdc0,&in_stack_fffffffffffffdb8->super_FabArrayBase,
               SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0));
    while( true ) {
      nghost = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
      bVar2 = amrex::MFIter::isValid((MFIter *)local_128);
      if (!bVar2) break;
      in_stack_fffffffffffffdb8 = (FabArray<amrex::FArrayBox> *)(local_128 + 0xf0);
      __s = std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                      ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                       0x7d22ba);
      in_stack_fffffffffffffdb0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_190 + 0x20)
      ;
      in_stack_fffffffffffffdc0 = (FabArray<amrex::FArrayBox> *)local_128;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffffd98,(MFIter *)in_stack_fffffffffffffd90);
      local_130._M_pi = in_stack_fffffffffffffdb0;
      this_00 = (FabArrayBase *)
                std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator->
                          ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
                           0x7d22f3);
      local_190._28_4_ = amrex::FabArrayBase::nComp(this_00);
      bx = (Box *)(in_RDI[7].bigend.vect + 2);
      amrex::MFIter::index((MFIter *)in_stack_fffffffffffffdc0,(char *)__s,__c);
      this_02 = (BoxArray *)local_190;
      amrex::BoxArray::operator[]
                (in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
      amrex::BoxArray::intersections
                (this_02,bx,
                 (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffdc0);
      local_198 = local_128 + 0x60;
      local_1a0._M_current =
           (pair<int,_amrex::Box> *)
           std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
           begin((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )in_stack_fffffffffffffd88);
      local_1a8 = (pair<int,_amrex::Box> *)
                  std::
                  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
                  end((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       *)in_stack_fffffffffffffd88);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                            *)in_stack_fffffffffffffd90,
                           (__normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                            *)in_stack_fffffffffffffd88);
        if (!bVar2) break;
        local_1b0 = __gnu_cxx::
                    __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
                    ::operator*(&local_1a0);
        in_stack_fffffffffffffda0 = (BoxArray *)&local_1b0->second;
        in_stack_fffffffffffffdac = local_190._28_4_;
        memcpy(local_1f0,local_130._M_pi,0x3c);
        amrex::
        ParallelFor<int,NavierStokesBase::volWgtSum(std::__cxx11::string_const&,double)::__0,void>
                  (in_RDI,(int)((ulong)puVar4 >> 0x20),(anon_class_64_1_54b72f38 *)f);
        __gnu_cxx::
        __normal_iterator<std::pair<int,_amrex::Box>_*,_std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>_>
        ::operator++(&local_1a0);
      }
      amrex::MFIter::operator++((MFIter *)local_128);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_fffffffffffffd90);
    std::vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::~vector
              ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *)
               in_stack_fffffffffffffda0);
    amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffd90);
  }
  if ((0.0 < volWgtSum_sub_dz) && (0.0 < volWgtSum_sub_Rcyl)) {
    local_8 = "EB volWgtSum currently only works over entire cartesian domain.";
    amrex::Abort_host((char *)in_stack_fffffffffffffda0);
  }
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::operator*
            ((unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
             in_stack_fffffffffffffd90);
  this_01 = (unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> *)
            amrex::
            ReduceSum<amrex::FArrayBox,amrex::FArrayBox,NavierStokesBase::volWgtSum(std::__cxx11::string_const&,double)::__1,void>
                      (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,nghost,
                       (anon_class_8_1_ba1d8433 *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  local_28 = this_01;
  amrex::ParallelDescriptor::ReduceRealSum<double>((double *)&local_28);
  std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>::~unique_ptr(this_01);
  return (Real)local_28;
}

Assistant:

Real
NavierStokesBase::volWgtSum (const std::string& name,
                             Real               time)
{
    Real  volwgtsum = 0.0;
    const Real* dx  = geom.CellSize();
    auto        mf  = derive(name,time,0);

    // First, zero covered regions
    if (level < parent->finestLevel())
    {
        BoxArray    baf;
        baf = parent->boxArray(level+1);
        baf.coarsen(fine_ratio);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
{
	std::vector< std::pair<int,Box> > isects;
        for (MFIter mfi(*mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
           auto const& fabarr = mf->array(mfi);
           int          ncomp = mf->nComp();
           baf.intersections(grids[mfi.index()],isects);

	   for (const auto& is : isects)
	   {
	      amrex::ParallelFor(is.second, ncomp, [fabarr]
              AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
              {
                 fabarr(i,j,k,n) = 0.0;
              });
           }
        }
}
    }

    // Use amrex::ReduceSum
    // TODO set the cases for RZ, but it needs the radius to be somewhere in managed memory and so on
    Real vol = D_TERM(dx[0],*dx[1],*dx[2]);
#ifdef AMREX_USE_EB
    if ( (volWgtSum_sub_dz > 0 && volWgtSum_sub_Rcyl > 0) ) {
        amrex::Abort("EB volWgtSum currently only works over entire cartesian domain.");
    }
    Real sm = amrex::ReduceSum(*mf, *volfrac, 0, [vol]
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& mf_arr, Array4<Real const> const& vf_arr) -> Real
    {
        Real sum = 0.0;
        AMREX_LOOP_3D(bx, i, j, k,
        {
            sum += mf_arr(i,j,k) * vf_arr(i,j,k) * vol;
        });
        return sum;
    });
#else
    const Real* dom_lo = geom.ProbLo();
    const Real sub_dz = volWgtSum_sub_dz;
    const Real sub_Rcyl = volWgtSum_sub_Rcyl;
    Real sm = amrex::ReduceSum(*mf, 0, [vol, sub_dz, sub_Rcyl, dx, dom_lo]
    AMREX_GPU_HOST_DEVICE (Box const& bx, Array4<Real const> const& mf_arr) -> Real
    {
        Real sum = 0.0;
        if ( sub_dz > 0 && sub_Rcyl > 0 ) {
           // TODO : test this in 2D
           const auto lo = amrex::lbound(bx);
           const auto hi = amrex::ubound(bx);
           for       (int k = lo.z; k <= hi.z; ++k) {
              Real z = dom_lo[2] + (k+0.5_rt) * dx[2];
              if ( z <= sub_dz ) {
                 for    (int j = lo.y; j <= hi.y; ++j) {
                    Real y = dom_lo[1] + (j+0.5_rt) * dx[1];
                    for (int i = lo.x; i <= hi.x; ++i) {
                       Real x = dom_lo[0] + (i+0.5_rt) * dx[0];
                       Real r = std::sqrt(x*x + y*y);
                       if ( r <= sub_Rcyl ) {
                          sum += mf_arr(i,j,k) * vol;
                       }
                    }
                 }
              }
           }
        } else {
           AMREX_LOOP_3D(bx, i, j, k,
           {
               sum += mf_arr(i,j,k) * vol;
           });
        }
        return sum;
    });
#endif

    volwgtsum = sm;

    ParallelDescriptor::ReduceRealSum(volwgtsum);

    return volwgtsum;
}